

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geopolyBlobFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  GeoPoly *pGVar1;
  void *in_RDX;
  undefined4 in_ESI;
  GeoPoly *p;
  undefined4 in_stack_00000018;
  _func_void_void_ptr *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  pGVar1 = geopolyFuncParam((sqlite3_context *)CONCAT44(argc,in_stack_00000018),
                            (sqlite3_value *)argv,&p->nVertex);
  if (pGVar1 != (GeoPoly *)0x0) {
    sqlite3_result_blob((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                        (int)((ulong)pGVar1 >> 0x20),in_stack_ffffffffffffffd8);
    sqlite3_free((void *)0x29fb7a);
  }
  return;
}

Assistant:

static void geopolyBlobFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p = geopolyFuncParam(context, argv[0], 0);
  (void)argc;
  if( p ){
    sqlite3_result_blob(context, p->hdr,
       4+8*p->nVertex, SQLITE_TRANSIENT);
    sqlite3_free(p);
  }
}